

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O3

void __thiscall CPlayer::TryRespawn(CPlayer *this)

{
  bool bVar1;
  CCharacter *this_00;
  long in_FS_OFFSET;
  vec2 SpawnPos;
  vec2 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = IGameController::CanSpawn(this->m_pGameServer->m_pController,this->m_Team,&local_28);
  if (bVar1) {
    this->m_Spawning = false;
    this_00 = (CCharacter *)CCharacter::operator_new(0x360,this->m_ClientID);
    CCharacter::CCharacter(this_00,&this->m_pGameServer->m_World);
    this->m_pCharacter = this_00;
    CCharacter::Spawn(this_00,this,local_28);
    CGameContext::CreatePlayerSpawn(this->m_pGameServer,local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CPlayer::TryRespawn()
{
	vec2 SpawnPos;

	if(!GameServer()->m_pController->CanSpawn(m_Team, &SpawnPos))
		return;

	m_Spawning = false;
	m_pCharacter = new(m_ClientID) CCharacter(&GameServer()->m_World);
	m_pCharacter->Spawn(this, SpawnPos);
	GameServer()->CreatePlayerSpawn(SpawnPos);
}